

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O1

idx_t __thiscall
duckdb::GroupedAggregateHashTable::FindOrCreateGroupsInternal
          (GroupedAggregateHashTable *this,DataChunk *groups,Vector *group_hashes_v,
          Vector *addresses_v,SelectionVector *new_groups_out)

{
  DataChunk *this_00;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  ht_entry_t *phVar5;
  ulong uVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  ulong uVar10;
  bool bVar11;
  TupleDataChunkState *pTVar12;
  Vector *this_01;
  undefined8 this_02;
  Vector *pVVar13;
  idx_t need_compare_idx;
  ulong uVar14;
  TupleDataLayout *types;
  reference pvVar15;
  reference other;
  pointer this_03;
  SelectionVector *pSVar16;
  type pTVar17;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *puVar18;
  InternalException *pIVar19;
  ulong uVar20;
  idx_t iVar21;
  PartitionedTupleDataAppendState *pPVar22;
  long lVar23;
  size_type __n;
  sel_t sVar24;
  ulong uVar25;
  ulong uVar26;
  idx_t iVar27;
  size_type __n_00;
  Vector *count;
  ulong append_count;
  undefined1 auVar28 [16];
  double dVar29;
  optional_ptr<duckdb::PartitionedTupleDataAppendState,_true> local_108;
  Vector *local_100;
  DataChunk *local_f8;
  SelectionVector *local_f0;
  idx_t local_e8;
  undefined1 local_e0 [32];
  idx_t no_match_count;
  Vector *local_b8;
  PartitionedTupleDataAppendState *local_b0;
  shared_ptr<duckdb::TupleDataLayout,_true> *local_a8;
  SelectionVector *local_a0;
  data_ptr_t local_98;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *local_90;
  TupleDataChunkState *local_88;
  PartitionedTupleDataAppendState *local_80;
  SelectionVector *local_78;
  RowMatcher *local_70;
  SelectionVector *local_68;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *local_60;
  TupleDataChunkState *local_58;
  ulong local_50;
  data_ptr_t local_48;
  SelectionVector *local_40;
  ulong local_38;
  
  local_e8 = groups->count;
  uVar14 = this->count + local_e8;
  uVar26 = this->capacity;
  local_100 = group_hashes_v;
  local_b8 = addresses_v;
  local_40 = new_groups_out;
  if ((uVar26 < uVar14) ||
     (auVar28._8_4_ = (int)(uVar26 >> 0x20), auVar28._0_8_ = uVar26, auVar28._12_4_ = 0x45300000,
     dVar29 = ((auVar28._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar26) - 4503599627370496.0)) / 1.25,
     uVar20 = (ulong)dVar29,
     ((long)(dVar29 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20) < uVar14)) {
    Resize(this,uVar26 * 2);
  }
  local_f0 = FlatVector::IncrementalSelectionVector();
  this_00 = &(this->state).group_chunk;
  if (*(pointer *)
       ((long)&(this->state).group_chunk.data.
               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data + 8) ==
      (this->state).group_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    types = shared_ptr<duckdb::TupleDataLayout,_true>::operator->
                      (&(this->super_BaseAggregateHashTable).layout_ptr);
    DataChunk::InitializeEmpty(this_00,&types->types);
  }
  if ((groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
  }
  else {
    __n_00 = 0;
    do {
      pvVar15 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n_00);
      other = vector<duckdb::Vector,_true>::operator[](&groups->data,__n_00);
      Vector::Reference(pvVar15,other);
      __n_00 = __n_00 + 1;
      __n = ((long)(groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (__n_00 < __n);
  }
  local_b0 = &(this->state).partitioned_append_state;
  pvVar15 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
  this_01 = local_100;
  Vector::Reference(pvVar15,local_100);
  (this->state).group_chunk.count = groups->count;
  local_58 = &(this->state).partitioned_append_state.chunk_state;
  TupleDataCollection::ToUnifiedFormat(local_58,this_00);
  count = (Vector *)local_e8;
  Vector::Flatten(this_01,local_e8);
  pVVar13 = local_b8;
  pdVar1 = this_01->data;
  Vector::Flatten(local_b8,(idx_t)count);
  pdVar2 = pVVar13->data;
  if (this->skip_lookups == false) {
    pdVar3 = (this->state).ht_offsets.data;
    pdVar4 = (this->state).hash_salts.data;
    if (count == (Vector *)0x0) {
      uVar26 = 0;
    }
    else {
      phVar5 = this->entries;
      uVar26 = 0;
      iVar21 = 0;
      do {
        uVar14 = this->bitmask & *(ulong *)(pdVar1 + iVar21 * 8);
        *(ulong *)(pdVar3 + iVar21 * 8) = uVar14;
        uVar26 = (uVar26 + 1) - (ulong)(phVar5[uVar14].value == 0);
        *(ulong *)(pdVar4 + iVar21 * 8) = *(ulong *)(pdVar1 + iVar21 * 8) | 0xffffffffffff;
        iVar21 = iVar21 + 1;
      } while (count != (Vector *)iVar21);
    }
    uVar14 = this->capacity;
    if (uVar14 == 0 || count == (Vector *)0x0) {
      uVar20 = 0;
      local_100 = (Vector *)0x0;
    }
    else {
      local_60 = &this->partitioned_data;
      local_80 = &(this->state).unpartitioned_append_state;
      local_88 = &(this->state).unpartitioned_append_state.chunk_state;
      local_90 = &this->unpartitioned_data;
      local_68 = &(this->state).empty_vector;
      local_a8 = &(this->super_BaseAggregateHashTable).layout_ptr;
      local_70 = &this->row_matcher;
      local_78 = &(this->state).group_compare_vector;
      local_a0 = &(this->state).no_match_vector;
      local_100 = (Vector *)0x0;
      uVar20 = 0;
      pSVar16 = local_f0;
      local_f8 = this_00;
      local_98 = pdVar2;
      local_48 = pdVar4;
      do {
        no_match_count = 0;
        local_f0 = (SelectionVector *)pSVar16->sel_vector;
        local_e8 = (long)count + (ulong)(count == (Vector *)0x0);
        phVar5 = this->entries;
        append_count = 0;
        iVar21 = 0;
        uVar14 = 0;
        do {
          uVar25 = uVar14;
          if (local_f0 != (SelectionVector *)0x0) {
            uVar25 = (ulong)*(uint *)((long)&local_f0->sel_vector + uVar14 * 4);
          }
          if (this->capacity == 0) {
            iVar27 = 0;
          }
          else {
            uVar6 = *(ulong *)(local_48 + uVar25 * 8);
            psVar7 = (this->state).group_compare_vector.sel_vector;
            psVar8 = (this->state).empty_vector.sel_vector;
            psVar9 = local_40->sel_vector;
            iVar27 = 0;
            do {
              lVar23 = *(long *)(pdVar3 + uVar25 * 8);
              uVar10 = phVar5[lVar23].value;
              sVar24 = (sel_t)uVar25;
              if (uVar10 == 0) {
                phVar5[lVar23].value = uVar6;
                psVar8[append_count] = sVar24;
                append_count = append_count + 1;
                psVar9[(long)local_100] = sVar24;
                local_100 = (Vector *)((long)local_100 + 1);
                bVar11 = false;
              }
              else if ((uVar10 | 0xffffffffffff) == uVar6) {
                psVar7[iVar21] = sVar24;
                iVar21 = iVar21 + 1;
                bVar11 = false;
              }
              else {
                *(ulong *)(pdVar3 + uVar25 * 8) = lVar23 + 1U & this->bitmask;
                bVar11 = true;
              }
            } while ((bVar11) && (iVar27 = iVar27 + 1, iVar27 < this->capacity));
          }
          local_50 = uVar20;
          local_38 = uVar26;
          if (iVar27 == this->capacity) {
            pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
            local_e0._0_8_ = local_e0 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e0,
                       "Maximum inner iteration count reached in GroupedAggregateHashTable","");
            InternalException::InternalException(pIVar19,(string *)local_e0);
            __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != local_e8);
        if (iVar21 + append_count < uVar26) {
          pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
          local_e0._0_8_ = local_e0 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e0,"Internal validation failed in GroupedAggregateHashTable",""
                    );
          InternalException::InternalException(pIVar19,(string *)local_e0);
          __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (append_count != 0) {
          local_e0._0_8_ = (PartitionedTupleData *)0x0;
          local_108.ptr = (PartitionedTupleDataAppendState *)0x0;
          puVar18 = local_60;
          pPVar22 = local_b0;
          if (append_count >> ((byte)this->radix_bits & 0x3f) < 5 && 2 < this->radix_bits) {
            TupleDataCollection::ToUnifiedFormat(local_88,local_f8);
            puVar18 = local_90;
            pPVar22 = local_80;
          }
          local_e0._0_8_ =
               (puVar18->
               super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
               .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
          local_108.ptr = pPVar22;
          optional_ptr<duckdb::PartitionedTupleData,_true>::CheckValid
                    ((optional_ptr<duckdb::PartitionedTupleData,_true> *)local_e0);
          this_02 = local_e0._0_8_;
          optional_ptr<duckdb::PartitionedTupleDataAppendState,_true>::CheckValid(&local_108);
          PartitionedTupleData::AppendUnified
                    ((PartitionedTupleData *)this_02,local_108.ptr,local_f8,local_68,append_count);
          pTVar17 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(local_a8);
          optional_ptr<duckdb::PartitionedTupleDataAppendState,_true>::CheckValid(&local_108);
          pTVar12 = &(local_108.ptr)->chunk_state;
          pSVar16 = FlatVector::IncrementalSelectionVector();
          RowOperations::InitializeStates(pTVar17,&pTVar12->row_locations,pSVar16,append_count);
          optional_ptr<duckdb::PartitionedTupleDataAppendState,_true>::CheckValid(&local_108);
          pdVar1 = ((local_108.ptr)->chunk_state).row_locations.data;
          optional_ptr<duckdb::PartitionedTupleDataAppendState,_true>::CheckValid(&local_108);
          lVar23 = 0;
          do {
            uVar14 = (ulong)(this->state).empty_vector.sel_vector[lVar23];
            uVar26 = *(ulong *)(pdVar1 + (ulong)((local_108.ptr)->reverse_partition_sel).sel_vector
                                                [uVar14] * 8);
            this->entries[*(long *)(pdVar3 + uVar14 * 8)].value =
                 this->entries[*(long *)(pdVar3 + uVar14 * 8)].value & (uVar26 | 0xffff000000000000)
            ;
            *(ulong *)(local_98 + uVar14 * 8) = uVar26;
            lVar23 = lVar23 + 1;
          } while (append_count + (append_count == 0) != lVar23);
        }
        if (iVar21 != 0) {
          iVar27 = 0;
          do {
            uVar26 = (ulong)(this->state).group_compare_vector.sel_vector[iVar27];
            *(hash_t *)(local_98 + uVar26 * 8) =
                 this->entries[*(long *)(pdVar3 + uVar26 * 8)].value & 0xffffffffffff;
            iVar27 = iVar27 + 1;
          } while (iVar21 != iVar27);
          pTVar17 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(local_a8);
          RowMatcher::Match(local_70,local_f8,&local_58->vector_data,local_78,iVar21,pTVar17,
                            local_b8,local_a0,&no_match_count);
        }
        if (no_match_count != 0) {
          psVar7 = (this->state).no_match_vector.sel_vector;
          uVar26 = 0;
          do {
            uVar14 = (ulong)psVar7[uVar26];
            *(ulong *)(pdVar3 + uVar14 * 8) = *(long *)(pdVar3 + uVar14 * 8) + 1U & this->bitmask;
            uVar26 = uVar26 + 1;
          } while (uVar26 < no_match_count);
        }
        uVar20 = local_50 + 1;
        uVar14 = this->capacity;
      } while ((no_match_count != 0) &&
              (uVar26 = 0, pSVar16 = local_a0, count = (Vector *)no_match_count, uVar20 < uVar14));
    }
    count = local_100;
    if (uVar20 == uVar14) {
      pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
      local_e0._0_8_ = local_e0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,
                 "Maximum outer iteration count reached in GroupedAggregateHashTable","");
      InternalException::InternalException(pIVar19,(string *)local_e0);
      __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    this_03 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
              ::operator->(&this->partitioned_data);
    pSVar16 = FlatVector::IncrementalSelectionVector();
    PartitionedTupleData::AppendUnified(this_03,local_b0,this_00,pSVar16,(idx_t)count);
    pTVar17 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*
                        (&(this->super_BaseAggregateHashTable).layout_ptr);
    pSVar16 = FlatVector::IncrementalSelectionVector();
    RowOperations::InitializeStates
              (pTVar17,&(this->state).partitioned_append_state.chunk_state.row_locations,pSVar16,
               (idx_t)count);
    if (count != (Vector *)0x0) {
      pdVar1 = (this->state).partitioned_append_state.chunk_state.row_locations.data;
      iVar21 = 0;
      do {
        *(undefined8 *)(pdVar2 + iVar21 * 8) =
             *(undefined8 *)
              (pdVar1 + (ulong)(this->state).partitioned_append_state.reverse_partition_sel.
                               sel_vector[iVar21] * 8);
        iVar21 = iVar21 + 1;
      } while (count != (Vector *)iVar21);
    }
  }
  this->count = this->count + (long)count;
  return (idx_t)count;
}

Assistant:

idx_t GroupedAggregateHashTable::FindOrCreateGroupsInternal(DataChunk &groups, Vector &group_hashes_v,
                                                            Vector &addresses_v, SelectionVector &new_groups_out) {
	D_ASSERT(groups.ColumnCount() + 1 == layout_ptr->ColumnCount());
	D_ASSERT(group_hashes_v.GetType() == LogicalType::HASH);
	D_ASSERT(state.ht_offsets.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(state.ht_offsets.GetType() == LogicalType::UBIGINT);
	D_ASSERT(addresses_v.GetType() == LogicalType::POINTER);
	D_ASSERT(state.hash_salts.GetType() == LogicalType::HASH);

	// Need to fit the entire vector, and resize at threshold
	const auto chunk_size = groups.size();
	if (Count() + chunk_size > capacity || Count() + chunk_size > ResizeThreshold()) {
		Verify();
		Resize(capacity * 2);
	}
	D_ASSERT(capacity - Count() >= chunk_size); // we need to be able to fit at least one vector of data

	// we start out with all entries [0, 1, 2, ..., chunk_size]
	const SelectionVector *sel_vector = FlatVector::IncrementalSelectionVector();

	// Make a chunk that references the groups and the hashes and convert to unified format
	if (state.group_chunk.ColumnCount() == 0) {
		state.group_chunk.InitializeEmpty(layout_ptr->GetTypes());
	}
	D_ASSERT(state.group_chunk.ColumnCount() == layout_ptr->GetTypes().size());
	for (idx_t grp_idx = 0; grp_idx < groups.ColumnCount(); grp_idx++) {
		state.group_chunk.data[grp_idx].Reference(groups.data[grp_idx]);
	}
	state.group_chunk.data[groups.ColumnCount()].Reference(group_hashes_v);
	state.group_chunk.SetCardinality(groups);

	// convert all vectors to unified format
	TupleDataCollection::ToUnifiedFormat(state.partitioned_append_state.chunk_state, state.group_chunk);

	group_hashes_v.Flatten(chunk_size);
	const auto hashes = FlatVector::GetData<hash_t>(group_hashes_v);

	addresses_v.Flatten(chunk_size);
	const auto addresses = FlatVector::GetData<data_ptr_t>(addresses_v);

	if (skip_lookups) {
		// Just appending now
		partitioned_data->AppendUnified(state.partitioned_append_state, state.group_chunk,
		                                *FlatVector::IncrementalSelectionVector(), chunk_size);
		RowOperations::InitializeStates(*layout_ptr, state.partitioned_append_state.chunk_state.row_locations,
		                                *FlatVector::IncrementalSelectionVector(), chunk_size);

		const auto row_locations =
		    FlatVector::GetData<data_ptr_t>(state.partitioned_append_state.chunk_state.row_locations);
		const auto &row_sel = state.partitioned_append_state.reverse_partition_sel;
		for (idx_t i = 0; i < chunk_size; i++) {
			const auto &row_idx = row_sel[i];
			const auto &row_location = row_locations[row_idx];
			addresses[i] = row_location;
		}
		count += chunk_size;
		return chunk_size;
	}

	// Compute the entry in the table based on the hash using a modulo,
	// and precompute the hash salts for faster comparison below
	const auto ht_offsets = FlatVector::GetData<uint64_t>(state.ht_offsets);
	const auto hash_salts = FlatVector::GetData<hash_t>(state.hash_salts);

	// We also compute the occupied count, which is essentially useless.
	// However, this loop is branchless, while the main lookup loop below is not.
	// So, by doing the lookups here, we better amortize cache misses.
	idx_t occupied_count = 0;
	for (idx_t r = 0; r < chunk_size; r++) {
		const auto &hash = hashes[r];
		auto &ht_offset = ht_offsets[r];
		ht_offset = ApplyBitMask(hash);
		occupied_count += entries[ht_offset].IsOccupied(); // Lookup
		D_ASSERT(ht_offset == hash % capacity);
		hash_salts[r] = ht_entry_t::ExtractSalt(hash);
	}

	idx_t new_group_count = 0;
	idx_t remaining_entries = chunk_size;
	idx_t iteration_count;
	for (iteration_count = 0; remaining_entries > 0 && iteration_count < capacity; iteration_count++) {
		idx_t new_entry_count = 0;
		idx_t need_compare_count = 0;
		idx_t no_match_count = 0;

		// For each remaining entry, figure out whether or not it belongs to a full or empty group
		for (idx_t i = 0; i < remaining_entries; i++) {
			const auto index = sel_vector->get_index(i);
			const auto salt = hash_salts[index];
			auto &ht_offset = ht_offsets[index];

			idx_t inner_iteration_count;
			for (inner_iteration_count = 0; inner_iteration_count < capacity; inner_iteration_count++) {
				auto &entry = entries[ht_offset];
				if (!entry.IsOccupied()) { // Unoccupied: claim it
					entry.SetSalt(salt);
					state.empty_vector.set_index(new_entry_count++, index);
					new_groups_out.set_index(new_group_count++, index);
					break;
				}

				if (DUCKDB_LIKELY(entry.GetSalt() == salt)) { // Matching salt: compare groups
					state.group_compare_vector.set_index(need_compare_count++, index);
					break;
				}

				// Linear probing
				IncrementAndWrap(ht_offset, bitmask);
			}
			if (DUCKDB_UNLIKELY(inner_iteration_count == capacity)) {
				throw InternalException("Maximum inner iteration count reached in GroupedAggregateHashTable");
			}
		}

		if (DUCKDB_UNLIKELY(occupied_count > new_entry_count + need_compare_count)) {
			// We use the useless occupied_count we summed above here so the variable is used,
			// and the compiler cannot optimize away the vectorized lookups above. This should never be triggered.
			throw InternalException("Internal validation failed in GroupedAggregateHashTable");
		}
		occupied_count = 0; // Have to set to 0 for next iterations

		if (new_entry_count != 0) {
			// Append everything that belongs to an empty group
			optional_ptr<PartitionedTupleData> data;
			optional_ptr<PartitionedTupleDataAppendState> append_state;
			if (radix_bits >= UNPARTITIONED_RADIX_BITS_THRESHOLD &&
			    new_entry_count / RadixPartitioning::NumberOfPartitions(radix_bits) <= 4) {
				TupleDataCollection::ToUnifiedFormat(state.unpartitioned_append_state.chunk_state, state.group_chunk);
				data = unpartitioned_data.get();
				append_state = &state.unpartitioned_append_state;
			} else {
				data = partitioned_data.get();
				append_state = &state.partitioned_append_state;
			}
			data->AppendUnified(*append_state, state.group_chunk, state.empty_vector, new_entry_count);
			RowOperations::InitializeStates(*layout_ptr, append_state->chunk_state.row_locations,
			                                *FlatVector::IncrementalSelectionVector(), new_entry_count);

			// Set the entry pointers in the 1st part of the HT now that the data has been appended
			const auto row_locations = FlatVector::GetData<data_ptr_t>(append_state->chunk_state.row_locations);
			const auto &row_sel = append_state->reverse_partition_sel;
			for (idx_t new_entry_idx = 0; new_entry_idx < new_entry_count; new_entry_idx++) {
				const auto &index = state.empty_vector[new_entry_idx];
				const auto &row_idx = row_sel[index];
				const auto &row_location = row_locations[row_idx];

				auto &entry = entries[ht_offsets[index]];

				entry.SetPointer(row_location);
				addresses[index] = row_location;
			}
		}

		if (need_compare_count != 0) {
			// Get the pointers to the rows that need to be compared
			for (idx_t need_compare_idx = 0; need_compare_idx < need_compare_count; need_compare_idx++) {
				const auto &index = state.group_compare_vector[need_compare_idx];
				const auto &entry = entries[ht_offsets[index]];
				addresses[index] = entry.GetPointer();
			}

			// Perform group comparisons
			row_matcher.Match(state.group_chunk, state.partitioned_append_state.chunk_state.vector_data,
			                  state.group_compare_vector, need_compare_count, *layout_ptr, addresses_v,
			                  &state.no_match_vector, no_match_count);
		}

		// Linear probing: each of the entries that do not match move to the next entry in the HT
		for (idx_t i = 0; i < no_match_count; i++) {
			const auto &index = state.no_match_vector[i];
			auto &ht_offset = ht_offsets[index];
			IncrementAndWrap(ht_offset, bitmask);
		}
		sel_vector = &state.no_match_vector;
		remaining_entries = no_match_count;
	}
	if (iteration_count == capacity) {
		throw InternalException("Maximum outer iteration count reached in GroupedAggregateHashTable");
	}

	count += new_group_count;
	return new_group_count;
}